

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

void test_mp_get_nbits(void)

{
  mp_int *r;
  mp_int *a;
  size_t sVar1;
  ulong uVar2;
  mp_int *b;
  size_t *psVar3;
  
  r = mp_new(0x200);
  a = mp_from_integer(0);
  sVar1 = (*looplimit)(10);
  if (sVar1 != 0) {
    psVar3 = test_mp_get_nbits::bitposns;
    uVar2 = 0;
    b = a;
    do {
      a = mp_power_2(*psVar3);
      mp_add_into(r,a,b);
      mp_free(b);
      test_index = test_index + 1;
      last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
      (*log_to_file)(last_filename);
      mp_get_nbits(r);
      (*log_to_file)((char *)0x0);
      safefree(last_filename);
      uVar2 = uVar2 + 1;
      sVar1 = (*looplimit)(10);
      psVar3 = psVar3 + 1;
      b = a;
    } while (uVar2 < sVar1);
  }
  mp_free(a);
  mp_free(r);
  return;
}

Assistant:

static void test_mp_get_nbits(void)
{
    mp_int *z = mp_new(512);
    static const size_t bitposns[] = {
        0, 1, 5, 16, 23, 32, 67, 123, 234, 511
    };
    mp_int *prev = mp_from_integer(0);
    for (size_t i = 0; i < looplimit(lenof(bitposns)); i++) {
        mp_int *x = mp_power_2(bitposns[i]);
        mp_add_into(z, x, prev);
        mp_free(prev);
        prev = x;
        log_start();
        mp_get_nbits(z);
        log_end();
    }
    mp_free(prev);
    mp_free(z);
}